

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeObject::~IfcTypeObject(IfcTypeObject *this)

{
  pointer pLVar1;
  undefined1 *puVar2;
  
  *(undefined ***)&this[-1].field_0x70 = &PTR__IfcTypeObject_00806c48;
  *(undefined ***)&this->field_0x58 = &PTR__IfcTypeObject_00806cc0;
  *(undefined ***)&this[-1].field_0xf8 = &PTR__IfcTypeObject_00806c70;
  *(undefined ***)this = &PTR__IfcTypeObject_00806c98;
  if (*(void **)&this->field_0x38 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x38);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x70 = 0x806dd8;
  *(undefined8 *)&this->field_0x58 = 0x806e00;
  pLVar1 = this[-1].HasPropertySets.ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)&this[-1].HasPropertySets.ptr.
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(pLVar1);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x10;
  if (puVar2 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x20
     ) {
    operator_delete(puVar2);
  }
  if (*(undefined1 **)&this[-1].field_0x80 != &this[-1].field_0x90) {
    operator_delete(*(undefined1 **)&this[-1].field_0x80);
  }
  operator_delete(&this[-1].field_0x70);
  return;
}

Assistant:

IfcTypeObject() : Object("IfcTypeObject") {}